

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O2

void __thiscall
cfd::core::ScriptOperator::ScriptOperator(ScriptOperator *this,ScriptType data_type,string *text)

{
  string *__k;
  iterator iVar1;
  iterator iVar2;
  string sStack_38;
  
  this->_vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_005c1ac0;
  this->data_type_ = data_type;
  __k = &this->text_data_;
  ::std::__cxx11::string::string((string *)__k,(string *)text);
  if (text->_M_string_length == 0) {
    if (g_operator_map._40_8_ != 0) {
      ToString_abi_cxx11_(&sStack_38,this);
      ::std::__cxx11::string::operator=((string *)__k,(string *)&sStack_38);
      ::std::__cxx11::string::~string((string *)&sStack_38);
    }
  }
  else {
    iVar1 = ::std::
            _Rb_tree<cfd::core::ScriptType,_std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>,_std::_Select1st<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>,_std::less<cfd::core::ScriptType>,_std::allocator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>_>
            ::find((_Rb_tree<cfd::core::ScriptType,_std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>,_std::_Select1st<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>,_std::less<cfd::core::ScriptType>,_std::allocator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>_>
                    *)g_operator_map,&this->data_type_);
    if (iVar1._M_node == (_Base_ptr)(g_operator_map + 8)) {
      ::std::
      _Rb_tree<cfd::core::ScriptType,std::pair<cfd::core::ScriptType_const,cfd::core::ScriptOperator>,std::_Select1st<std::pair<cfd::core::ScriptType_const,cfd::core::ScriptOperator>>,std::less<cfd::core::ScriptType>,std::allocator<std::pair<cfd::core::ScriptType_const,cfd::core::ScriptOperator>>>
      ::_M_emplace_unique<cfd::core::ScriptType&,cfd::core::ScriptOperator&>
                ((_Rb_tree<cfd::core::ScriptType,std::pair<cfd::core::ScriptType_const,cfd::core::ScriptOperator>,std::_Select1st<std::pair<cfd::core::ScriptType_const,cfd::core::ScriptOperator>>,std::less<cfd::core::ScriptType>,std::allocator<std::pair<cfd::core::ScriptType_const,cfd::core::ScriptOperator>>>
                  *)g_operator_map,&this->data_type_,this);
    }
    iVar2 = ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>_>
                    *)g_operator_text_map_abi_cxx11_,__k);
    if (iVar2._M_node == (_Base_ptr)(g_operator_text_map_abi_cxx11_ + 8)) {
      ::std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::ScriptOperator>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::ScriptOperator>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::ScriptOperator>>>
      ::_M_emplace_unique<std::__cxx11::string&,cfd::core::ScriptOperator&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::ScriptOperator>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::ScriptOperator>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::ScriptOperator>>>
                  *)g_operator_text_map_abi_cxx11_,__k,this);
    }
  }
  return;
}

Assistant:

ScriptOperator::ScriptOperator(ScriptType data_type, const std::string& text)
    : data_type_(data_type), text_data_(text) {
  // map register the const definition at production timing
  if (text.empty()) {
    if (!g_operator_map.empty()) {
      text_data_ = ToString();
    }
  } else {
    if (g_operator_map.find(data_type_) == g_operator_map.end()) {
      g_operator_map.emplace(data_type_, *this);
    }
    if (g_operator_text_map.find(text_data_) == g_operator_text_map.end()) {
      g_operator_text_map.emplace(text_data_, *this);
    }
  }
}